

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O2

void __thiscall NaParams::ListOfParamsToLog(NaParams *this)

{
  long lVar1;
  long lVar2;
  
  NaPrintLog("----------------------------->8----------------------------\n");
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < this->stored_n; lVar1 = lVar1 + 1) {
    NaPrintLog("%s=%s\n",*(undefined8 *)((long)this->storage + lVar2 + -8),
               *(undefined8 *)((long)&this->storage->name + lVar2));
    lVar2 = lVar2 + 0x10;
  }
  NaPrintLog("-----------------------------8<----------------------------\n");
  return;
}

Assistant:

void
NaParams::ListOfParamsToLog () const
{
  int	i;
  NaPrintLog("----------------------------->8----------------------------\n");
  for(i = 0; i < stored_n; ++i)
    NaPrintLog("%s=%s\n", storage[i].name, storage[i].value);
  NaPrintLog("-----------------------------8<----------------------------\n");
}